

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError WriteStream(PaStream *s,void *buffer,unsigned_long frames)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  unsigned_long numFrames;
  ulong uVar4;
  char *format;
  snd_pcm_uframes_t framesGot;
  int xrun;
  void *userBuffer;
  snd_pcm_uframes_t framesAvail;
  PaError local_64;
  unsigned_long local_60;
  int local_54;
  void *local_50;
  ulong local_48;
  undefined8 local_40;
  PaUtilBufferProcessor *local_38;
  
  if (s == (PaStream *)0x0) {
    __assert_fail("stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x114d,"PaError WriteStream(PaStream *, const void *, unsigned long)");
  }
  local_40 = *(undefined8 *)((long)s + 0x2c0);
  if (*(long *)((long)s + 0x340) == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->playback.pcm\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4431\n"
                     );
    local_64 = -0x26f6;
  }
  else {
    *(undefined8 *)((long)s + 0x2c0) = 0;
    local_64 = 0;
    if (0.0 < *(double *)((long)s + 0x278)) {
      *(undefined8 *)((long)s + 0x278) = 0;
      local_64 = -0x26fc;
    }
    local_50 = buffer;
    if (*(int *)((long)s + 0x318) == 0) {
      local_50 = *(void **)((long)s + 0x368);
      memcpy(local_50,buffer,(long)*(int *)((long)s + 0x310) << 3);
    }
    local_38 = (PaUtilBufferProcessor *)((long)s + 0x68);
    do {
      if (frames == 0) break;
      local_54 = 0;
      paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)s,&local_48,&local_54);
      if (paUtilErr_ < 0) {
        format = 
        "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4455\n"
        ;
LAB_0010b870:
        bVar2 = false;
        PaUtil_DebugPrint(format);
        local_64 = paUtilErr_;
      }
      else {
        local_60 = local_48;
        if (frames <= local_48) {
          local_60 = frames;
        }
        paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)s,&local_60,&local_54);
        if (paUtilErr_ < 0) {
          format = 
          "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4458\n"
          ;
          goto LAB_0010b870;
        }
        if (local_60 != 0) {
          numFrames = PaUtil_CopyOutput(local_38,&local_50,local_60);
          local_60 = numFrames;
          paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)s,numFrames,&local_54);
          if (paUtilErr_ < 0) {
            format = 
            "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4462\n"
            ;
            goto LAB_0010b870;
          }
          frames = frames - numFrames;
        }
        uVar4 = GetStreamWriteAvailable(s);
        paUtilErr_ = (PaError)uVar4;
        if (paUtilErr_ < 0) {
          format = 
          "Expression \'err = GetStreamWriteAvailable( stream )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 4469\n"
          ;
          goto LAB_0010b870;
        }
        lVar1 = *(long *)((long)s + 0x350);
        local_48 = uVar4;
        iVar3 = snd_pcm_state(*(undefined8 *)((long)s + 0x340));
        bVar2 = true;
        if (((iVar3 == 2) && (*(ulong *)((long)s + 0x348) <= lVar1 - uVar4)) &&
           (iVar3 = snd_pcm_start(*(undefined8 *)((long)s + 0x340)), iVar3 < 0)) {
          WriteStream_cold_1();
          local_64 = -9999;
          bVar2 = false;
        }
      }
    } while (bVar2);
  }
  *(undefined8 *)((long)s + 0x2c0) = local_40;
  return local_64;
}

Assistant:

static PaError WriteStream( PaStream* s, const void *buffer, unsigned long frames )
{
    PaError result = paNoError;
    signed long err;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    snd_pcm_uframes_t framesGot, framesAvail;
    const void *userBuffer;
    snd_pcm_t *save = stream->capture.pcm;

    assert( stream );

    PA_UNLESS( stream->playback.pcm, paCanNotWriteToAnInputOnlyStream );

    /* Disregard capture */
    stream->capture.pcm = NULL;

    if( stream->underrun > 0. )
    {
        result = paOutputUnderflowed;
        stream->underrun = 0.0;
    }

    if( stream->playback.userInterleaved )
        userBuffer = buffer;
    else /* Copy channels into local array */
    {
        userBuffer = stream->playback.userBuffers;
        memcpy( (void *)userBuffer, buffer, sizeof (void *) * stream->playback.numUserChannels );
    }

    while( frames > 0 )
    {
        int xrun = 0;
        snd_pcm_uframes_t hwAvail;

        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        framesGot = PA_MIN( framesAvail, frames );

        PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
        if( framesGot > 0 )
        {
            framesGot = PaUtil_CopyOutput( &stream->bufferProcessor, &userBuffer, framesGot );
            PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            frames -= framesGot;
        }

        /* Start stream after one period of samples worth */

        /* Frames residing in buffer */
        PA_ENSURE( err = GetStreamWriteAvailable( stream ) );
        framesAvail = err;
        hwAvail = stream->playback.alsaBufferSize - framesAvail;

        if( alsa_snd_pcm_state( stream->playback.pcm ) == SND_PCM_STATE_PREPARED &&
                hwAvail >= stream->playback.framesPerPeriod )
        {
            ENSURE_( alsa_snd_pcm_start( stream->playback.pcm ), paUnanticipatedHostError );
        }
    }

end:
    stream->capture.pcm = save;
    return result;
error:
    goto end;
}